

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool ON_Font::TestInstalledFontList(ON_TextLog *text_log)

{
  ON_FontFaceQuartet *this;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_FontList *this_00;
  ON_SimpleArray<const_ON_Font_*> *this_01;
  ON_Font **ppOVar5;
  ON_SHA1_Hash *pOVar6;
  ON_Font *pOVar7;
  ON_ClassArray<ON_FontFaceQuartet> *this_02;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  ON_wString *local_2f8;
  bool bIsItalicInQuartet;
  bool bIsBoldInQuartet;
  ON_Font *f2;
  ON_SHA1_Hash h_1;
  ON_wString qname1;
  uint k;
  ON_wString local_1c8 [4];
  ON_wString OStack_1a8;
  byte local_1a0 [4];
  bool local_19c [4];
  bool bExpectedIsItalicInQuartet [4];
  bool bExpectedIsBoldInQuartet [4];
  ON_Font *f1_1 [4];
  ON_Font *f_2 [4];
  undefined1 local_150 [23];
  bool bQuartetFromQuartetNamePass;
  ON_FontFaceQuartet q1;
  undefined1 local_110 [8];
  ON_wString qname;
  ON_FontFaceQuartet *q;
  uint i_1;
  uint error_count_1;
  ON_TextLogIndent indent1_1;
  uint quartet_count;
  ON_ClassArray<ON_FontFaceQuartet> *quartet_list;
  ON_Font *f_1;
  ON_Font *f1;
  ON_SHA1_Hash h;
  ON_Font *f;
  uint i;
  uint error_count;
  ON_TextLogIndent indent2;
  undefined1 local_48 [8];
  ON_TextLogIndent indent1;
  bool bPassedTest;
  bool bReturnFirst;
  ON_SimpleArray<const_ON_Font_*> *by_hash;
  uint font_count;
  ON_FontList *font_list;
  ON_TextLog *text_log_local;
  
  this_00 = InstalledFontList();
  uVar3 = ON_FontList::Count(this_00);
  if (uVar3 == 0) {
    ON_TextLog::Print(text_log,"ERROR: 0 = ON_Font::InstalledFontList().Count()\n");
    text_log_local._7_1_ = Internal_TestInstalledFontsFailure();
  }
  else {
    this_01 = ON_FontList::ByFontCharacteristicsHash(this_00);
    uVar4 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount(this_01);
    if (uVar3 == uVar4) {
      indent1._15_1_ = 0;
      indent1._14_1_ = 1;
      ON_TextLog::Print(text_log,"Testing %u installed fonts:\n",(ulong)uVar3);
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_48,text_log);
      ON_TextLog::Print(text_log,L"FromFontCharacteristicsHash() tests ...");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&i,text_log);
      for (f._0_4_ = 0; (uint)f < uVar3; f._0_4_ = (uint)f + 1) {
        ppOVar5 = ON_SimpleArray<const_ON_Font_*>::operator[](this_01,(uint)f);
        pOVar6 = FontCharacteristicsHash(*ppOVar5);
        ON_FontList::FromFontCharacteristicsHash(this_00,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
      }
      ON_TextLog::Print(text_log," passed.\n");
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&i);
      pOVar6 = FontCharacteristicsHash(&Default);
      pOVar7 = ON_FontList::FromFontCharacteristicsHash
                         (this_00,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
      if (pOVar7 == (ON_Font *)0x0) {
        ON_TextLog::Print(text_log,
                          "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
                         );
        indent1._14_1_ = 0;
      }
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_48);
      this_02 = ON_FontList::QuartetList(this_00);
      indent1_1._12_4_ = ON_ClassArray<ON_FontFaceQuartet>::UnsignedCount(this_02);
      ON_TextLog::Print(text_log,"Testing %u quartets:\n",(ulong)(uint)indent1_1._12_4_);
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&i_1,text_log);
      q._4_4_ = 0;
      for (q._0_4_ = 0; (uint)q < (uint)indent1_1._12_4_; q._0_4_ = (uint)q + 1) {
        qname.m_s = (wchar_t *)ON_ClassArray<ON_FontFaceQuartet>::operator[](this_02,(uint)q);
        ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_110);
        bVar1 = ON_wString::IsEmpty((ON_wString *)local_110);
        if (bVar1) {
          q._4_4_ = q._4_4_ + 1;
          ON_TextLog::Print(text_log,"ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n",
                            (ulong)(uint)q);
          indent1._14_1_ = 0;
          q1.m_bold_italic._4_4_ = 7;
        }
        else {
          pwVar8 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_110);
          ON_FontList::QuartetFromQuartetName
                    ((ON_FontFaceQuartet *)(local_150 + 0x10),this_00,pwVar8);
          ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_150);
          ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)(f_2 + 3));
          bVar1 = ::operator==((ON_wString *)local_150,(ON_wString *)(f_2 + 3));
          ON_wString::~ON_wString((ON_wString *)(f_2 + 3));
          ON_wString::~ON_wString((ON_wString *)local_150);
          local_150[0xf] = bVar1;
          f1_1[3] = ON_FontFaceQuartet::RegularFace((ON_FontFaceQuartet *)qname.m_s);
          f_2[0] = ON_FontFaceQuartet::BoldFace((ON_FontFaceQuartet *)qname.m_s);
          f_2[1] = ON_FontFaceQuartet::ItalicFace((ON_FontFaceQuartet *)qname.m_s);
          f_2[2] = ON_FontFaceQuartet::BoldItalicFace((ON_FontFaceQuartet *)qname.m_s);
          this = (ON_FontFaceQuartet *)(local_150 + 0x10);
          _bExpectedIsItalicInQuartet = ON_FontFaceQuartet::RegularFace(this);
          f1_1[0] = ON_FontFaceQuartet::BoldFace(this);
          f1_1[1] = ON_FontFaceQuartet::ItalicFace(this);
          f1_1[2] = ON_FontFaceQuartet::BoldItalicFace(this);
          local_19c[0] = false;
          local_19c[1] = true;
          local_19c[2] = false;
          local_19c[3] = true;
          local_1a0[0] = 0;
          local_1a0[1] = 0;
          local_1a0[2] = 1;
          local_1a0[3] = 1;
          ON_wString::ON_wString(local_1c8,L"regular");
          ON_wString::ON_wString(local_1c8 + 1,L"bold");
          ON_wString::ON_wString(local_1c8 + 2,L"italic");
          ON_wString::ON_wString(local_1c8 + 3,L"bolditalic");
          for (qname1.m_s._4_4_ = 0; qname1.m_s._4_4_ < 4; qname1.m_s._4_4_ = qname1.m_s._4_4_ + 1)
          {
            if (((local_150[0xf] & 1) != 0) &&
               (f1_1[(ulong)qname1.m_s._4_4_ + 3] !=
                *(ON_Font **)(bExpectedIsItalicInQuartet + (ulong)qname1.m_s._4_4_ * 8))) {
              local_150[0xf] = 0;
            }
            if (f1_1[(ulong)qname1.m_s._4_4_ + 3] != (ON_Font *)0x0) {
              ON_wString::ON_wString((ON_wString *)(h_1.m_digest + 0x10),(ON_wString *)local_110);
              ON_wString::operator+=((ON_wString *)(h_1.m_digest + 0x10),L" (");
              ON_wString::operator+=
                        ((ON_wString *)(h_1.m_digest + 0x10),local_1c8 + qname1.m_s._4_4_);
              ON_wString::operator+=((ON_wString *)(h_1.m_digest + 0x10),L")");
              pOVar6 = FontCharacteristicsHash(f1_1[(ulong)qname1.m_s._4_4_ + 3]);
              h_1.m_digest._8_4_ = *(undefined4 *)(pOVar6->m_digest + 0x10);
              h_1.m_digest._0_8_ = *(undefined8 *)(pOVar6->m_digest + 8);
              pOVar7 = ON_FontList::FromFontCharacteristicsHash
                                 (this_00,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
              if (pOVar7 != f1_1[(ulong)qname1.m_s._4_4_ + 3]) {
                q._4_4_ = q._4_4_ + 1;
                pwVar8 = ON_wString::Array((ON_wString *)(h_1.m_digest + 0x10));
                ON_TextLog::Print(text_log,
                                  "ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n"
                                  ,pwVar8);
                indent1._14_1_ = 0;
              }
              bVar1 = IsBoldInQuartet(f1_1[(ulong)qname1.m_s._4_4_ + 3]);
              bVar2 = IsItalicInQuartet(f1_1[(ulong)qname1.m_s._4_4_ + 3]);
              if (bVar1 != (bool)(bExpectedIsItalicInQuartet[(ulong)qname1.m_s._4_4_ - 4] & 1U)) {
                q._4_4_ = q._4_4_ + 1;
                pwVar8 = ON_wString::Array((ON_wString *)(h_1.m_digest + 0x10));
                pwVar9 = L"false";
                if (bVar1) {
                  pwVar9 = L"true";
                }
                ON_TextLog::Print(text_log,"ERROR: IsBoldInQuartet(%ls) = %ls.\n",pwVar8,pwVar9);
                indent1._14_1_ = 0;
              }
              if (bVar2 != (bool)(local_1a0[qname1.m_s._4_4_] & 1)) {
                q._4_4_ = q._4_4_ + 1;
                pwVar8 = ON_wString::Array((ON_wString *)(h_1.m_digest + 0x10));
                pwVar9 = L"false";
                if (bVar2) {
                  pwVar9 = L"true";
                }
                ON_TextLog::Print(text_log,"ERROR: IsItalicInQuartet(%ls) = %ls.\n",pwVar8,pwVar9);
                indent1._14_1_ = 0;
              }
              ON_wString::~ON_wString((ON_wString *)(h_1.m_digest + 0x10));
            }
          }
          if ((local_150[0xf] & 1) == 0) {
            q._4_4_ = q._4_4_ + 1;
            pwVar8 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_110);
            ON_TextLog::Print(text_log,L"ERROR: QuartetFromQuartetName(%ls) failed.\n",pwVar8);
          }
          local_2f8 = &OStack_1a8;
          do {
            local_2f8 = local_2f8 + -1;
            ON_wString::~ON_wString(local_2f8);
          } while (local_2f8 != local_1c8);
          ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)(local_150 + 0x10));
          q1.m_bold_italic._4_4_ = 0;
        }
        ON_wString::~ON_wString((ON_wString *)local_110);
      }
      if (q._4_4_ == 0) {
        ON_TextLog::Print(text_log,"Passed.\n");
      }
      else {
        ON_TextLog::Print(text_log,"FAILED. %u quartet errors.\n",(ulong)q._4_4_);
      }
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&i_1);
      text_log_local._7_1_ = (bool)(indent1._14_1_ & 1);
    }
    else {
      ON_TextLog::Print(text_log,
                        "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
                       );
      text_log_local._7_1_ = Internal_TestInstalledFontsFailure();
    }
  }
  return text_log_local._7_1_;
}

Assistant:

bool ON_Font::TestInstalledFontList(ON_TextLog& text_log)
{
  const class ON_FontList& font_list = ON_Font::InstalledFontList();
  const unsigned font_count = font_list.Count();
  if (font_count <= 0)
  {
    text_log.Print("ERROR: 0 = ON_Font::InstalledFontList().Count()\n");
    return Internal_TestInstalledFontsFailure();
  }

  const ON_SimpleArray< const class ON_Font* >& by_hash = font_list.ByFontCharacteristicsHash();
  if (font_count != by_hash.UnsignedCount())
  {
    text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
    return Internal_TestInstalledFontsFailure();
  }

  const bool bReturnFirst = false;
  bool bPassedTest = true;

  text_log.Print("Testing %u installed fonts:\n", font_count);
  {
    const ON_TextLogIndent indent1(text_log);


    text_log.Print(L"FromFontCharacteristicsHash() tests ...");
    {
      ON_TextLogIndent indent2(text_log);
      unsigned error_count = 0;
      for (unsigned i = 0; i < font_count; ++i)
      {
        const ON_Font* f = by_hash[i];
        const ON_SHA1_Hash h = f->FontCharacteristicsHash();

        const ON_Font* f1 = f = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
        if (f != f1)
        {
          if (0 == error_count)
            text_log.PrintNewLine();
          ++error_count;
          text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(by_hash[%u],false).\n", i);
          bPassedTest = false;
        }
      }
      if (error_count > 0)
        text_log.Print("FAILED. %u errors.\n", error_count);
      else
        text_log.Print(" passed.\n");
    }

    {
      const ON_Font* f = font_list.FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(), bReturnFirst);
      if (nullptr == f)
      {
        text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
        bPassedTest = false;
      }
    }
  }

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = font_list.QuartetList();
  const unsigned quartet_count = quartet_list.UnsignedCount();
  text_log.Print("Testing %u quartets:\n", quartet_count);
  {
    const ON_TextLogIndent indent1(text_log);

    unsigned error_count = 0;
    for (unsigned i = 0; i < quartet_count; ++i)
    {
      const ON_FontFaceQuartet& q = quartet_list[i];
      const ON_wString qname = q.QuartetName();
      if (qname.IsEmpty())
      {
        ++error_count;
        text_log.Print("ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n", i);
        bPassedTest = false;
        continue;
      }
      const ON_FontFaceQuartet q1 = font_list.QuartetFromQuartetName(qname);
      bool bQuartetFromQuartetNamePass = q.QuartetName() == q1.QuartetName();
      const ON_Font* f[4] = { q.RegularFace(),q.BoldFace(),q.ItalicFace(),q.BoldItalicFace() };
      const ON_Font* f1[4] = { q1.RegularFace(),q1.BoldFace(),q1.ItalicFace(),q1.BoldItalicFace() };
      const bool bExpectedIsBoldInQuartet[4] = { false,true,false,true };
      const bool bExpectedIsItalicInQuartet[4] = { false,false,true,true };
      const ON_wString qface[4] = { ON_wString(L"regular"), ON_wString(L"bold"), ON_wString(L"italic"), ON_wString(L"bolditalic") };
      for (unsigned k = 0; k < 4; ++k)
      {
        if (bQuartetFromQuartetNamePass && f[k] != f1[k])
          bQuartetFromQuartetNamePass = false;
        if (nullptr != f[k])
        {
          ON_wString qname1 = qname;
          qname1 += L" (";
          qname1 += qface[k];
          qname1 += L")";
          const ON_SHA1_Hash h = f[k]->FontCharacteristicsHash();
          const ON_Font* f2 = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
          if (f2 != f[k])
          {
            ++error_count;
            text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n", qname1.Array());
            bPassedTest = false;
          }
          const bool bIsBoldInQuartet = f[k]->IsBoldInQuartet();
          const bool bIsItalicInQuartet = f[k]->IsItalicInQuartet();
          if (bIsBoldInQuartet != bExpectedIsBoldInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsBoldInQuartet(%ls) = %ls.\n", qname1.Array(), bIsBoldInQuartet?L"true":L"false");
            bPassedTest = false;
          }
          if (bIsItalicInQuartet != bExpectedIsItalicInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsItalicInQuartet(%ls) = %ls.\n", qname1.Array(), bIsItalicInQuartet ? L"true" : L"false");
            bPassedTest = false;
          }
        }
      }
      if (false == bQuartetFromQuartetNamePass)
      {
        ++error_count;
        text_log.Print(L"ERROR: QuartetFromQuartetName(%ls) failed.\n",static_cast<const wchar_t*>(qname));
      }
    }
    if (error_count > 0)
      text_log.Print("FAILED. %u quartet errors.\n", error_count);
    else
      text_log.Print("Passed.\n");
  }

  return bPassedTest;
}